

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::UDPSocketStream::receive(UDPSocketStream *this,IPV4Address *source)

{
  _func_int *p_Var1;
  size_type __new_size;
  int *piVar2;
  socklen_t addrLen;
  sockaddr_in addr;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_1058;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_1038;
  uchar buf [4096];
  
  addrLen = 0x10;
  __new_size = recvfrom(*(int *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x78,buf,
                        0x1000,0,(sockaddr *)&addr,&addrLen);
  if (0 < (long)__new_size) {
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->super_MemoryPacketStream).super_PacketStream.field_0x20,__new_size);
    local_1038._M_cur =
         *(_Elt_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x30;
    local_1038._M_first =
         *(_Elt_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x38;
    local_1038._M_last =
         *(_Elt_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x40;
    local_1038._M_node =
         *(_Map_pointer *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x48;
    std::copy<unsigned_char*,std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
              (&local_1058,buf,buf + __new_size,&local_1038);
    IPV4Address::IPV4Address
              ((IPV4Address *)&local_1058,
               addr.sin_addr.s_addr >> 0x18 | (addr.sin_addr.s_addr & 0xff0000) >> 8 |
               (addr.sin_addr.s_addr & 0xff00) << 8 | addr.sin_addr.s_addr << 0x18,
               addr.sin_port << 8 | addr.sin_port >> 8);
    source->port = local_1058._M_cur._4_2_;
    source->address = (uint)local_1058._M_cur;
    return;
  }
  p_Var1 = (this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream[-3];
  piVar2 = __errno_location();
  Stream::fail((Stream *)
               ((long)&(this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream +
               (long)p_Var1),ConnectionLost,*piVar2,"UDP Socket read I/O error.");
}

Assistant:

virtual void receive(IPV4Address& source)
		{
			unsigned char buf[4096];
			sockaddr_in addr;
			socklen_t addrLen = sizeof(addr);
			ssize_t recvCount = recvfrom(fd, buf, 4096, 0, (struct sockaddr*)&addr, &addrLen);
			if (recvCount <= 0)
				fail(DashelException::ConnectionLost, errno, "UDP Socket read I/O error.");

			receptionBuffer.resize(recvCount);
			std::copy(buf, buf + recvCount, receptionBuffer.begin());

			source = IPV4Address(ntohl(addr.sin_addr.s_addr), ntohs(addr.sin_port));
		}